

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

int enet_protocol_send_reliable_outgoing_commands(ENetHost *host,ENetPeer *peer)

{
  short *psVar1;
  byte *pbVar2;
  ENetList *position;
  ushort uVar3;
  _ENetListNode *p_Var4;
  _ENetListNode *p_Var5;
  _ENetListNode *p_Var6;
  _ENetListNode *p_Var7;
  _ENetListNode *p_Var8;
  _ENetListNode *p_Var9;
  bool bVar10;
  long lVar11;
  undefined8 *puVar12;
  void *data;
  byte bVar13;
  int iVar14;
  ENetChannel *pEVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  _ENetListNode *position_00;
  bool bVar22;
  
  lVar11 = host->commandCount * 0x32 + 0x6c;
  lVar17 = host->bufferCount * 0x10 + 0x6b8;
  position = &peer->sentReliableCommands;
  bVar10 = false;
  position_00 = (peer->outgoingReliableCommands).sentinel.next;
  iVar16 = 0;
  iVar14 = 1;
LAB_00106d4c:
  do {
    if (position_00 == &(peer->outgoingReliableCommands).sentinel) {
LAB_00106ffc:
      host->commandCount = (lVar11 + -0x6c) / 0x32;
      host->bufferCount = lVar17 + -0x6b8 >> 4;
      return iVar14;
    }
    uVar19 = (ulong)*(byte *)((long)&position_00[2].previous + 1);
    if (peer->channelCount <= uVar19) {
      uVar21 = (uint)(*(ushort *)&position_00[1].next >> 0xc);
      bVar22 = true;
LAB_00106de1:
      pEVar15 = (ENetChannel *)0x0;
LAB_00106de3:
      if (position_00[6].next != (_ENetListNode *)0x0) {
        if (!bVar10) {
          uVar20 = peer->windowSize * peer->packetThrottle >> 5;
          if (uVar20 <= peer->mtu) {
            uVar20 = peer->mtu;
          }
          if ((uint)*(ushort *)((long)&position_00[2].next + 4) + peer->reliableDataInTransit <=
              uVar20) {
            bVar10 = false;
            goto LAB_00106e44;
          }
        }
        bVar10 = true;
        position_00 = position_00->next;
        goto LAB_00106d4c;
      }
LAB_00106e44:
      if ((lVar11 < 0x6ac) && (lVar17 < 0xab8)) {
        uVar19 = commandSizes[*(byte *)&position_00[2].previous & 0xf];
        uVar18 = (ulong)peer->mtu - host->packetSize;
        if ((uVar19 <= uVar18) &&
           ((position_00[6].next == (_ENetListNode *)0x0 ||
            ((uint)(ushort)(*(short *)((long)&position_00[2].next + 4) + (short)uVar19) <=
             ((uint)uVar18 & 0xffff))))) {
          p_Var4 = position_00->next;
          if ((!bVar22) && (*(short *)((long)&position_00[2].next + 6) == 0)) {
            pEVar15->usedReliableWindows =
                 pEVar15->usedReliableWindows | (ushort)(1 << (sbyte)uVar21);
            pEVar15->reliableWindows[uVar21] = pEVar15->reliableWindows[uVar21] + 1;
          }
          psVar1 = (short *)((long)&position_00[2].next + 6);
          *psVar1 = *psVar1 + 1;
          iVar14 = *(int *)&position_00[1].previous;
          if (iVar14 == 0) {
            iVar14 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
            *(int *)&position_00[1].previous = iVar14;
            *(enet_uint32 *)((long)&position_00[1].previous + 4) = peer->timeoutLimit * iVar14;
          }
          if ((position->sentinel).next == &position->sentinel) {
            peer->nextTimeout = iVar14 + host->serviceTime;
          }
          puVar12 = (undefined8 *)((long)host->commands + lVar11 + -0x6c);
          data = enet_list_remove(position_00);
          enet_list_insert(&position->sentinel,data);
          *(enet_uint32 *)((long)&position_00[1].next + 4) = host->serviceTime;
          *(undefined8 **)((long)host->commands + lVar17 + -0x6c) = puVar12;
          *(ulong *)((long)host->commands + lVar17 + -100) = uVar19;
          host->packetSize = host->packetSize + uVar19;
          pbVar2 = (byte *)((long)&host->headerFlags + 3);
          *pbVar2 = *pbVar2 | 8;
          *(undefined2 *)(puVar12 + 6) = *(undefined2 *)&position_00[5].previous;
          p_Var5 = position_00[2].previous;
          p_Var6 = position_00[3].next;
          p_Var7 = position_00[3].previous;
          p_Var8 = position_00[4].next;
          p_Var9 = position_00[5].next;
          puVar12[4] = position_00[4].previous;
          puVar12[5] = p_Var9;
          puVar12[2] = p_Var7;
          puVar12[3] = p_Var8;
          *puVar12 = p_Var5;
          puVar12[1] = p_Var6;
          if (position_00[6].next == (_ENetListNode *)0x0) {
            lVar17 = lVar17 + 0x10;
          }
          else {
            *(ulong *)((long)host->commands + lVar17 + -0x5c) =
                 (long)&(position_00[6].next[1].next)->next + (ulong)*(uint *)&position_00[2].next;
            uVar3 = *(ushort *)((long)&position_00[2].next + 4);
            *(ulong *)((long)host->commands + lVar17 + -0x54) = (ulong)uVar3;
            host->packetSize = host->packetSize + (ulong)uVar3;
            peer->reliableDataInTransit = peer->reliableDataInTransit + (uint)uVar3;
            lVar17 = lVar17 + 0x20;
          }
          peer->packetsSent = peer->packetsSent + 1;
          lVar11 = lVar11 + 0x32;
          iVar14 = 0;
          position_00 = p_Var4;
          goto LAB_00106d4c;
        }
      }
      host->continueSending = 1;
      iVar14 = 0;
      goto LAB_00106ffc;
    }
    uVar3 = *(ushort *)&position_00[1].next;
    uVar21 = (uint)(uVar3 >> 0xc);
    bVar22 = peer->channels == (ENetChannel *)0x0;
    if (bVar22) goto LAB_00106de1;
    if (iVar16 == 0) {
      pEVar15 = peer->channels + uVar19;
      iVar16 = 0;
      if (((uVar3 & 0xfff) == 0 && *(short *)((long)&position_00[2].next + 6) == 0) &&
         ((0xfff < pEVar15->reliableWindows[uVar21 - 1 & 0xf] ||
          (bVar13 = (byte)(uVar3 >> 0xc),
          ((0xffU >> (0x10 - bVar13 & 0x1f) | 0xff << bVar13) & (uint)pEVar15->usedReliableWindows)
          != 0)))) goto LAB_00106dc9;
      goto LAB_00106de3;
    }
LAB_00106dc9:
    position_00 = position_00->next;
    iVar16 = 1;
  } while( true );
}

Assistant:

static int
enet_protocol_send_reliable_outgoing_commands (ENetHost * host, ENetPeer * peer)
{
    ENetProtocol * command = & host -> commands [host -> commandCount];
    ENetBuffer * buffer = & host -> buffers [host -> bufferCount];
    ENetOutgoingCommand * outgoingCommand;
    ENetListIterator currentCommand;
    ENetChannel *channel;
    enet_uint16 reliableWindow;
    size_t commandSize;
    int windowExceeded = 0, windowWrap = 0, canPing = 1;

    currentCommand = enet_list_begin (& peer -> outgoingReliableCommands);
    
    while (currentCommand != enet_list_end (& peer -> outgoingReliableCommands))
    {
       outgoingCommand = (ENetOutgoingCommand *) currentCommand;

       channel = outgoingCommand -> command.header.channelID < peer -> channelCount ? & peer -> channels [outgoingCommand -> command.header.channelID] : NULL;
       reliableWindow = outgoingCommand -> reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
       if (channel != NULL)
       {
           if (! windowWrap &&      
               outgoingCommand -> sendAttempts < 1 && 
               ! (outgoingCommand -> reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) &&
               (channel -> reliableWindows [(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE ||
                 channel -> usedReliableWindows & ((((1 << ENET_PEER_FREE_RELIABLE_WINDOWS) - 1) << reliableWindow) | 
                   (((1 << ENET_PEER_FREE_RELIABLE_WINDOWS) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow)))))
             windowWrap = 1;
          if (windowWrap)
          {
             currentCommand = enet_list_next (currentCommand);
 
             continue;
          }
       }
 
       if (outgoingCommand -> packet != NULL)
       {
          if (! windowExceeded)
          {
             enet_uint32 windowSize = (peer -> packetThrottle * peer -> windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;
             
             if (peer -> reliableDataInTransit + outgoingCommand -> fragmentLength > ENET_MAX (windowSize, peer -> mtu))
               windowExceeded = 1;
          }
          if (windowExceeded)
          {
             currentCommand = enet_list_next (currentCommand);

             continue;
          }
       }

       canPing = 0;

       commandSize = commandSizes [outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK];
       if (command >= & host -> commands [sizeof (host -> commands) / sizeof (ENetProtocol)] ||
           buffer + 1 >= & host -> buffers [sizeof (host -> buffers) / sizeof (ENetBuffer)] ||
           peer -> mtu - host -> packetSize < commandSize ||
           (outgoingCommand -> packet != NULL && 
             (enet_uint16) (peer -> mtu - host -> packetSize) < (enet_uint16) (commandSize + outgoingCommand -> fragmentLength)))
       {
          host -> continueSending = 1;
          
          break;
       }

       currentCommand = enet_list_next (currentCommand);

       if (channel != NULL && outgoingCommand -> sendAttempts < 1)
       {
          channel -> usedReliableWindows |= 1 << reliableWindow;
          ++ channel -> reliableWindows [reliableWindow];
       }

       ++ outgoingCommand -> sendAttempts;
 
       if (outgoingCommand -> roundTripTimeout == 0)
       {
          outgoingCommand -> roundTripTimeout = peer -> roundTripTime + 4 * peer -> roundTripTimeVariance;
          outgoingCommand -> roundTripTimeoutLimit = peer -> timeoutLimit * outgoingCommand -> roundTripTimeout;
       }

       if (enet_list_empty (& peer -> sentReliableCommands))
         peer -> nextTimeout = host -> serviceTime + outgoingCommand -> roundTripTimeout;

       enet_list_insert (enet_list_end (& peer -> sentReliableCommands),
                         enet_list_remove (& outgoingCommand -> outgoingCommandList));

       outgoingCommand -> sentTime = host -> serviceTime;

       buffer -> data = command;
       buffer -> dataLength = commandSize;

       host -> packetSize += buffer -> dataLength;
       host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;

       * command = outgoingCommand -> command;

       if (outgoingCommand -> packet != NULL)
       {
          ++ buffer;
          
          buffer -> data = outgoingCommand -> packet -> data + outgoingCommand -> fragmentOffset;
          buffer -> dataLength = outgoingCommand -> fragmentLength;

          host -> packetSize += outgoingCommand -> fragmentLength;

          peer -> reliableDataInTransit += outgoingCommand -> fragmentLength;
       }

       ++ peer -> packetsSent;
        
       ++ command;
       ++ buffer;
    }

    host -> commandCount = command - host -> commands;
    host -> bufferCount = buffer - host -> buffers;

    return canPing;
}